

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

Symbol comment_type(Env *env)

{
  State *pSVar1;
  uint32_t uVar2;
  _Bool _Var3;
  uint uVar4;
  TSLexer *pTVar5;
  char cVar6;
  uint32_t rel;
  Symbol SVar7;
  
  uVar2 = 2;
  do {
    rel = uVar2;
    pSVar1 = env->state;
    uVar4 = (pSVar1->lookahead).offset + rel;
    if (uVar4 < (pSVar1->lookahead).size) {
      pTVar5 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
    }
    else {
      advance_before(env,rel);
      pTVar5 = env->lexer;
    }
    uVar2 = rel + 1;
  } while (pTVar5->lookahead == 0x2d);
  SVar7 = COMMENT;
  do {
    _Var3 = (*env->lexer->eof)(env->lexer);
    if (_Var3) {
      return COMMENT;
    }
    pSVar1 = env->state;
    uVar4 = (pSVar1->lookahead).offset + rel;
    if (uVar4 < (pSVar1->lookahead).size) {
      pTVar5 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
    }
    else {
      advance_before(env,rel);
      pTVar5 = env->lexer;
    }
    uVar4 = pTVar5->lookahead;
    cVar6 = '\x01';
    if (((uVar4 != 0x5e) && (uVar4 != 0x7c)) && (cVar6 = '\x05', 0xffffd01e < uVar4 - 0x3001)) {
      cVar6 = (("\x01"[uVar4 - 0x20 >> 3] >> (uVar4 & 7) & 1) == 0) * '\x05';
    }
    rel = rel + 1;
  } while (cVar6 == '\0');
  if (cVar6 != '\x05') {
    SVar7 = HADDOCK;
  }
  return SVar7;
}

Assistant:

static Symbol comment_type(Env *env) {
  uint32_t i = 2;
  while (peek(env, i) == '-') i++;
  while (not_eof(env)) {
    int32_t c = peek(env, i++);
    if (c == '|' || c == '^') return HADDOCK;
    else if (!is_space_char(c)) break;
  }
  return COMMENT;
}